

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp.c
# Opt level: O3

size_t shell_quotearg(char *path,uchar *buf,size_t bufsize)

{
  uchar *puVar1;
  uchar uVar2;
  uchar *puVar3;
  char *pcVar4;
  uchar *puVar5;
  uchar *puVar6;
  int iVar7;
  char cVar8;
  
  cVar8 = *path;
  puVar1 = buf + bufsize;
  puVar6 = buf;
  if (buf < buf + (bufsize - 1) && cVar8 != '\0') {
    pcVar4 = path + 1;
    iVar7 = 0;
    puVar3 = buf;
    do {
      if (cVar8 == '!') {
        if (iVar7 == 2) {
          puVar5 = puVar3 + 2;
          if (puVar1 <= puVar5) {
            return 0;
          }
          puVar3[0] = '\"';
          puVar3[1] = '\\';
        }
        else if (iVar7 == 1) {
          puVar5 = puVar3 + 2;
          if (puVar1 <= puVar5) {
            return 0;
          }
          puVar3[0] = '\'';
          puVar3[1] = '\\';
        }
        else {
          puVar5 = puVar3 + 1;
          if (puVar1 <= puVar5) {
            return 0;
          }
          *puVar3 = '\\';
        }
        iVar7 = 0;
      }
      else if (cVar8 == '\'') {
        if (iVar7 == 1) {
          if (puVar1 <= puVar3 + 2) {
            return 0;
          }
          puVar3[0] = '\'';
          puVar3[1] = '\"';
          puVar3 = puVar3 + 2;
        }
        else if (iVar7 == 0) {
          if (puVar1 <= puVar3 + 1) {
            return 0;
          }
          *puVar3 = '\"';
          puVar3 = puVar3 + 1;
        }
        iVar7 = 2;
        puVar5 = puVar3;
      }
      else {
        if (iVar7 == 2) {
          if (puVar1 <= puVar3 + 2) {
            return 0;
          }
          puVar3[0] = '\"';
          puVar3[1] = '\'';
          puVar3 = puVar3 + 2;
        }
        else if (iVar7 == 0) {
          if (puVar1 <= puVar3 + 1) {
            return 0;
          }
          *puVar3 = '\'';
          puVar3 = puVar3 + 1;
        }
        iVar7 = 1;
        puVar5 = puVar3;
      }
      puVar3 = puVar5 + 1;
      if (puVar1 <= puVar3) {
        return 0;
      }
      *puVar5 = pcVar4[-1];
      cVar8 = *pcVar4;
    } while ((cVar8 != '\0') && (pcVar4 = pcVar4 + 1, puVar3 < buf + (bufsize - 1)));
    if (iVar7 == 1) {
      uVar2 = '\'';
    }
    else {
      puVar6 = puVar3;
      if (iVar7 != 2) goto LAB_00122208;
      uVar2 = '\"';
    }
    puVar6 = puVar5 + 2;
    if (puVar1 <= puVar6) {
      return 0;
    }
    *puVar3 = uVar2;
  }
LAB_00122208:
  if (puVar1 <= puVar6 + 1) {
    return 0;
  }
  *puVar6 = '\0';
  return (long)puVar6 - (long)buf;
}

Assistant:

static size_t
shell_quotearg(const char *path, unsigned char *buf,
               size_t bufsize)
{
    const char *src;
    unsigned char *dst, *endp;

    /*
     * Processing States:
     *  UQSTRING:       unquoted string: ... -- used for quoting exclamation
     *                  marks. This is the initial state
     *  SQSTRING:       single-quoted-string: '... -- any character may follow
     *  QSTRING:        quoted string: "... -- only apostrophes may follow
     */
    enum { UQSTRING, SQSTRING, QSTRING } state = UQSTRING;

    endp = &buf[bufsize];
    src = path;
    dst = buf;
    while(*src && dst < endp - 1) {

        switch(*src) {
            /*
             * Special handling for apostrophe.
             * An apostrophe is always written in quotation marks, e.g.
             * ' -> "'".
             */

        case '\'':
            switch(state) {
            case UQSTRING:      /* Unquoted string */
                if(dst + 1 >= endp)
                    return 0;
                *dst++ = '"';
                break;
            case QSTRING:       /* Continue quoted string */
                break;
            case SQSTRING:      /* Close single quoted string */
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '\'';
                *dst++ = '"';
                break;
            default:
                break;
            }
            state = QSTRING;
            break;

            /*
             * Special handling for exclamation marks. CSH interprets
             * exclamation marks even when quoted with apostrophes. We convert
             * it to the plain string \!, because both Bourne Shell and CSH
             * interpret that as a verbatim exclamation mark.
             */

        case '!':
            switch(state) {
            case UQSTRING:
                if(dst + 1 >= endp)
                    return 0;
                *dst++ = '\\';
                break;
            case QSTRING:
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '"';           /* Closing quotation mark */
                *dst++ = '\\';
                break;
            case SQSTRING:              /* Close single quoted string */
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '\'';
                *dst++ = '\\';
                break;
            default:
                break;
            }
            state = UQSTRING;
            break;

            /*
             * Ordinary character: prefer single-quoted string
             */

        default:
            switch(state) {
            case UQSTRING:
                if(dst + 1 >= endp)
                    return 0;
                *dst++ = '\'';
                break;
            case QSTRING:
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '"';           /* Closing quotation mark */
                *dst++ = '\'';
                break;
            case SQSTRING:      /* Continue single quoted string */
                break;
            default:
                break;
            }
            state = SQSTRING;   /* Start single-quoted string */
            break;
        }

        if(dst + 1 >= endp)
            return 0;
        *dst++ = *src++;
    }

    switch(state) {
    case UQSTRING:
        break;
    case QSTRING:           /* Close quoted string */
        if(dst + 1 >= endp)
            return 0;
        *dst++ = '"';
        break;
    case SQSTRING:          /* Close single quoted string */
        if(dst + 1 >= endp)
            return 0;
        *dst++ = '\'';
        break;
    default:
        break;
    }

    if(dst + 1 >= endp)
        return 0;
    *dst = '\0';

    /* The result cannot be larger than 3 * strlen(path) + 2 */
    /* assert((dst - buf) <= (3 * (src - path) + 2)); */

    return dst - buf;
}